

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O0

bool __thiscall cmCTestLaunch::ScrapeLog(cmCTestLaunch *this,string *fname)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  char *pcVar3;
  undefined1 local_248 [8];
  string line;
  ifstream fin;
  string *fname_local;
  cmCTestLaunch *this_local;
  
  LoadScrapeRules(this);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  _Var2 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream((void *)((long)&line.field_2 + 8),pcVar3,_Var2);
  std::__cxx11::string::string((string *)local_248);
  do {
    bVar1 = cmsys::SystemTools::GetLineFromStream
                      ((istream *)(line.field_2._M_local_buf + 8),(string *)local_248,(bool *)0x0,-1
                      );
    if (!bVar1) {
      this_local._7_1_ = false;
      goto LAB_001ba9d5;
    }
    bVar1 = MatchesFilterPrefix(this,(string *)local_248);
  } while (((bVar1) || (bVar1 = Match(this,(string *)local_248,&this->RegexWarning), !bVar1)) ||
          (bVar1 = Match(this,(string *)local_248,&this->RegexWarningSuppress), bVar1));
  this_local._7_1_ = true;
LAB_001ba9d5:
  std::__cxx11::string::~string((string *)local_248);
  std::ifstream::~ifstream((void *)((long)&line.field_2 + 8));
  return this_local._7_1_;
}

Assistant:

bool cmCTestLaunch::ScrapeLog(std::string const& fname)
{
  this->LoadScrapeRules();

  // Look for log file lines matching warning expressions but not
  // suppression expressions.
  cmsys::ifstream fin(fname.c_str(), std::ios::in | std::ios::binary);
  std::string line;
  while (cmSystemTools::GetLineFromStream(fin, line)) {
    if (MatchesFilterPrefix(line)) {
      continue;
    }

    if (this->Match(line, this->RegexWarning) &&
        !this->Match(line, this->RegexWarningSuppress)) {
      return true;
    }
  }
  return false;
}